

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astMakeByteArrayNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  size_t i;
  sysbvm_tuple_t slotCount;
  anon_struct_40_5_779576b2 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.analyzedExpressions = 0;
  gcFrame.expression = 0;
  gcFrame.analyzedTupleNode = (sysbvm_astMakeByteArrayNode_t *)0x0;
  gcFrame.expressions = 0;
  gcFrame.analyzedExpression = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 5;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sVar1 = *arguments;
  gcFrame.expressions = *(ulong *)(sVar1 + 0x28);
  if (((gcFrame.expressions & 0xf) == 0 && gcFrame.expressions != 0) &&
     (7 < *(uint *)(gcFrame.expressions + 0xc))) {
    slotCount = (sysbvm_tuple_t)(*(uint *)(gcFrame.expressions + 0xc) >> 3);
  }
  else {
    if (*(long *)(sVar1 + 0x20) != 0) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
      sysbvm_stackFrame_popRecord(&local_48);
      return *arguments;
    }
    slotCount = 0;
  }
  gcFrame.analyzedTupleNode =
       (sysbvm_astMakeByteArrayNode_t *)sysbvm_context_shallowCopy(context,sVar1);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.analyzedTupleNode)->super).analyzerToken = sVar1;
  gcFrame.analyzedExpressions = sysbvm_array_create(context,slotCount);
  for (sVar1 = 0; slotCount != sVar1; sVar1 = sVar1 + 1) {
    if ((gcFrame.expressions & 0xf) == 0 && gcFrame.expressions != 0) {
      gcFrame.expression = *(sysbvm_tuple_t *)(gcFrame.expressions + 0x10 + sVar1 * 8);
    }
    else {
      gcFrame.expression = 0;
    }
    gcFrame.analyzedExpression =
         sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                   (context,gcFrame.expression,arguments[1]);
    if ((gcFrame.analyzedExpressions & 0xf) == 0 && gcFrame.analyzedExpressions != 0) {
      *(sysbvm_tuple_t *)(gcFrame.analyzedExpressions + 0x10 + sVar1 * 8) =
           gcFrame.analyzedExpression;
    }
  }
  ((gcFrame.analyzedTupleNode)->super).analyzedType = (context->roots).byteArrayType;
  (gcFrame.analyzedTupleNode)->elements = gcFrame.analyzedExpressions;
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_48);
  return (sysbvm_tuple_t)gcFrame.analyzedTupleNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeByteArrayNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeByteArrayNode_t **tupleNode = (sysbvm_astMakeByteArrayNode_t**)node;

    struct {
        sysbvm_astMakeByteArrayNode_t *analyzedTupleNode;
        sysbvm_tuple_t expressions;
        sysbvm_tuple_t analyzedExpressions;
        sysbvm_tuple_t expression;
        sysbvm_tuple_t analyzedExpression;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*tupleNode)->super.sourcePosition);

    gcFrame.expressions = (*tupleNode)->elements;
    size_t expressionCount = sysbvm_array_getSize(gcFrame.expressions);
    if(expressionCount == 0 && (*tupleNode)->super.analyzedType)
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return *node;
    }

    gcFrame.analyzedTupleNode = (sysbvm_astMakeByteArrayNode_t *)sysbvm_context_shallowCopy(context, *node);
    gcFrame.analyzedTupleNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    
    gcFrame.analyzedExpressions = sysbvm_array_create(context, expressionCount);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at(gcFrame.expressions, i);
        gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.expression, *environment);
        sysbvm_array_atPut(gcFrame.analyzedExpressions, i, gcFrame.analyzedExpression);
    }

    gcFrame.analyzedTupleNode->super.analyzedType = context->roots.byteArrayType;
    gcFrame.analyzedTupleNode->elements = gcFrame.analyzedExpressions;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedTupleNode;
}